

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::bindTexture(ReferenceContext *this,deUint32 target,deUint32 texture)

{
  _Rb_tree_header *p_Var1;
  int unitNdx;
  Texture3D *object;
  TextureCubeArray *object_00;
  Texture1D *object_01;
  Texture2D *object_02;
  Texture2DArray *object_03;
  int iVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  _Base_ptr p_Var5;
  TextureCube *pTVar6;
  bool bVar7;
  pair<unsigned_int,_sglr::rc::Texture_*> local_38;
  
  unitNdx = this->m_activeTexture;
  if ((int)target < 0x8513) {
    if ((1 < target - 0xde0) && (target != 0x806f)) goto LAB_00812560;
  }
  else if (((target != 0x8513) && (target != 0x8c1a)) && (target != 0x9009)) goto LAB_00812560;
  if ((target == 0xde0) && (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) == 0)) {
LAB_00812560:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
    return;
  }
  if (texture == 0) {
    uVar4 = target & 0xffff;
    if (0x8512 < uVar4) {
      if (uVar4 == 0x8513) {
        pTVar6 = (this->m_textureUnits).
                 super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                 ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeBinding;
        if (pTVar6 == (TextureCube *)0x0) {
          return;
        }
        rc::ObjectManager<sglr::rc::Texture>::releaseReference
                  (&this->m_textures,&pTVar6->super_Texture);
        (this->m_textureUnits).
        super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
        ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeBinding = (TextureCube *)0x0;
        return;
      }
      if (uVar4 == 0x8c1a) {
        object_03 = (this->m_textureUnits).
                    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DArrayBinding;
        if (object_03 == (Texture2DArray *)0x0) {
          return;
        }
        rc::ObjectManager<sglr::rc::Texture>::releaseReference
                  (&this->m_textures,&object_03->super_Texture);
        (this->m_textureUnits).
        super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
        ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DArrayBinding = (Texture2DArray *)0x0
        ;
        return;
      }
      if (uVar4 != 0x9009) {
        return;
      }
      object_00 = (this->m_textureUnits).
                  super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                  ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeArrayBinding;
      if (object_00 == (TextureCubeArray *)0x0) {
        return;
      }
      rc::ObjectManager<sglr::rc::Texture>::releaseReference
                (&this->m_textures,&object_00->super_Texture);
      (this->m_textureUnits).
      super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
      ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeArrayBinding =
           (TextureCubeArray *)0x0;
      return;
    }
    if (uVar4 == 0xde0) {
      object_01 = (this->m_textureUnits).
                  super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                  ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex1DBinding;
      if (object_01 == (Texture1D *)0x0) {
        return;
      }
      rc::ObjectManager<sglr::rc::Texture>::releaseReference
                (&this->m_textures,&object_01->super_Texture);
      (this->m_textureUnits).
      super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
      ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex1DBinding = (Texture1D *)0x0;
      return;
    }
    if (uVar4 == 0xde1) {
      object_02 = (this->m_textureUnits).
                  super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                  ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DBinding;
      if (object_02 == (Texture2D *)0x0) {
        return;
      }
      rc::ObjectManager<sglr::rc::Texture>::releaseReference
                (&this->m_textures,&object_02->super_Texture);
      (this->m_textureUnits).
      super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
      ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DBinding = (Texture2D *)0x0;
      return;
    }
    if (uVar4 != 0x806f) {
      return;
    }
    object = (this->m_textureUnits).
             super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex3DBinding;
    if (object == (Texture3D *)0x0) {
      return;
    }
    rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,&object->super_Texture)
    ;
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex3DBinding = (Texture3D *)0x0;
    return;
  }
  p_Var5 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      bVar7 = p_Var5[1]._M_color < texture;
      if (!bVar7) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar7];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var3[1]._M_color <= texture)) &&
       (pTVar6 = (TextureCube *)p_Var3[1]._M_parent, pTVar6 != (TextureCube *)0x0)) {
      uVar4 = target & 0xffff;
      iVar2 = 6;
      if (uVar4 < 0x8513) {
        if (uVar4 == 0xde0) {
          iVar2 = 0;
        }
        else if (uVar4 == 0xde1) {
          iVar2 = 1;
        }
        else if (uVar4 == 0x806f) {
          iVar2 = 4;
        }
      }
      else if (uVar4 == 0x8513) {
        iVar2 = 2;
      }
      else if (uVar4 == 0x8c1a) {
        iVar2 = 3;
      }
      else if (uVar4 == 0x9009) {
        iVar2 = 5;
      }
      if ((pTVar6->super_Texture).m_type != iVar2) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
      goto LAB_008127fa;
    }
  }
  uVar4 = target & 0xffff;
  pTVar6 = (TextureCube *)0x0;
  if (uVar4 < 0x8513) {
    if (uVar4 == 0xde0) {
      pTVar6 = (TextureCube *)operator_new(0x5b0);
      rc::Texture1D::Texture1D((Texture1D *)pTVar6,texture);
    }
    else if (uVar4 == 0xde1) {
      pTVar6 = (TextureCube *)operator_new(0x5b0);
      rc::Texture2D::Texture2D((Texture2D *)pTVar6,texture);
    }
    else {
      pTVar6 = (TextureCube *)0x0;
      if (uVar4 == 0x806f) {
        pTVar6 = (TextureCube *)operator_new(0x5b0);
        rc::Texture3D::Texture3D((Texture3D *)pTVar6,texture);
      }
    }
  }
  else if (uVar4 == 0x8513) {
    pTVar6 = (TextureCube *)operator_new(0x2018);
    rc::TextureCube::TextureCube(pTVar6,texture);
  }
  else if (uVar4 == 0x8c1a) {
    pTVar6 = (TextureCube *)operator_new(0x5b0);
    rc::Texture2DArray::Texture2DArray((Texture2DArray *)pTVar6,texture);
  }
  else if (uVar4 == 0x9009) {
    pTVar6 = (TextureCube *)operator_new(0x5b0);
    rc::TextureCubeArray::TextureCubeArray((TextureCubeArray *)pTVar6,texture);
  }
  local_38.first = (pTVar6->super_Texture).super_NamedObject.m_name;
  if ((this->m_textures).m_lastName < local_38.first) {
    (this->m_textures).m_lastName = local_38.first;
  }
  local_38.second = &pTVar6->super_Texture;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Texture*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Texture*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Texture*>>>
  ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::Texture*>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Texture*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Texture*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Texture*>>>
              *)&(this->m_textures).m_objects,&local_38);
LAB_008127fa:
  uVar4 = target & 0xffff;
  if (0x8512 < uVar4) {
    if (uVar4 == 0x8513) {
      setTexCubeBinding(this,unitNdx,pTVar6);
      return;
    }
    if (uVar4 != 0x8c1a) {
      if (uVar4 != 0x9009) {
        return;
      }
      setTexCubeArrayBinding(this,unitNdx,(TextureCubeArray *)pTVar6);
      return;
    }
    setTex2DArrayBinding(this,unitNdx,(Texture2DArray *)pTVar6);
    return;
  }
  if (uVar4 == 0xde0) {
    setTex1DBinding(this,unitNdx,(Texture1D *)pTVar6);
    return;
  }
  if (uVar4 != 0xde1) {
    if (uVar4 != 0x806f) {
      return;
    }
    setTex3DBinding(this,unitNdx,(Texture3D *)pTVar6);
    return;
  }
  setTex2DBinding(this,unitNdx,(Texture2D *)pTVar6);
  return;
}

Assistant:

void ReferenceContext::bindTexture (deUint32 target, deUint32 texture)
{
	int unitNdx = m_activeTexture;

	RC_IF_ERROR(target != GL_TEXTURE_1D				&&
				target != GL_TEXTURE_2D				&&
				target != GL_TEXTURE_CUBE_MAP		&&
				target != GL_TEXTURE_2D_ARRAY		&&
				target != GL_TEXTURE_3D				&&
				target != GL_TEXTURE_CUBE_MAP_ARRAY,
				GL_INVALID_ENUM, RC_RET_VOID);

	RC_IF_ERROR(glu::isContextTypeES(m_limits.contextType) && (target == GL_TEXTURE_1D), GL_INVALID_ENUM, RC_RET_VOID);

	if (texture == 0)
	{
		// Clear binding.
		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, DE_NULL);	break;
			default:
				DE_ASSERT(false);
		}
	}
	else
	{
		Texture* texObj = m_textures.find(texture);

		if (texObj)
		{
			// Validate type.
			Texture::Type expectedType = Texture::TYPE_LAST;
			switch (target)
			{
				case GL_TEXTURE_1D:				expectedType = Texture::TYPE_1D;				break;
				case GL_TEXTURE_2D:				expectedType = Texture::TYPE_2D;				break;
				case GL_TEXTURE_CUBE_MAP:		expectedType = Texture::TYPE_CUBE_MAP;			break;
				case GL_TEXTURE_2D_ARRAY:		expectedType = Texture::TYPE_2D_ARRAY;			break;
				case GL_TEXTURE_3D:				expectedType = Texture::TYPE_3D;				break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	expectedType = Texture::TYPE_CUBE_MAP_ARRAY;	break;
				default:
					DE_ASSERT(false);
			}
			RC_IF_ERROR(texObj->getType() != expectedType, GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
		{
			// New texture object.
			switch (target)
			{
				case GL_TEXTURE_1D:				texObj = new Texture1D			(texture);	break;
				case GL_TEXTURE_2D:				texObj = new Texture2D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP:		texObj = new TextureCube		(texture);	break;
				case GL_TEXTURE_2D_ARRAY:		texObj = new Texture2DArray		(texture);	break;
				case GL_TEXTURE_3D:				texObj = new Texture3D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	texObj = new TextureCubeArray	(texture);	break;
				default:
					DE_ASSERT(false);
			}

			m_textures.insert(texObj);
		}

		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, static_cast<Texture1D*>			(texObj));	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, static_cast<Texture2D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, static_cast<TextureCube*>			(texObj));	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, static_cast<Texture2DArray*>		(texObj));	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, static_cast<Texture3D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, static_cast<TextureCubeArray*>	(texObj));	break;
			default:
				DE_ASSERT(false);
		}
	}
}